

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCC.h
# Opt level: O0

void __thiscall dg::SCC<dg::pta::PSNode>::_compute(SCC<dg::pta::PSNode> *this,PSNode *n)

{
  bool bVar1;
  PSNode *n_00;
  uint *puVar2;
  size_type sVar3;
  NodeInfo *pNVar4;
  uint uVar5;
  SCC<dg::pta::PSNode> *in_RSI;
  value_type *in_RDI;
  NodeInfo *winfo;
  PSNode *w;
  size_t component_num;
  SCC_component_t component;
  NodeInfo *succ_info;
  PSNode *succ;
  const_iterator __end0;
  const_iterator __begin0;
  NodesVec *__range2;
  NodeInfo *info;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffff78;
  QueueLIFO<dg::pta::PSNode_*> *in_stack_ffffffffffffff80;
  QueueLIFO<dg::pta::PSNode_*> *this_00;
  NodeInfo *in_stack_ffffffffffffff90;
  PSNode *in_stack_ffffffffffffff98;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_28;
  NodesVec *local_20;
  
  n_00 = (PSNode *)
         CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                   ((CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U> *)
                    in_stack_ffffffffffffff98,(PSNode **)in_stack_ffffffffffffff90);
  uVar5 = *(int *)(in_RDI + 0x1a) + 1;
  *(uint *)(in_RDI + 0x1a) = uVar5;
  *(uint *)((long)&n_00->_vptr_PSNode + 4) = uVar5;
  *(uint *)&n_00->_vptr_PSNode = uVar5;
  *(bool *)&(n_00->super_SubgraphNode<dg::pta::PSNode>).id = true;
  ADT::QueueLIFO<dg::pta::PSNode_*>::push
            (in_stack_ffffffffffffff80,(PSNode **)in_stack_ffffffffffffff78);
  local_20 = SubgraphNode<dg::pta::PSNode>::successors
                       ((SubgraphNode<dg::pta::PSNode> *)
                        &(in_RSI->stack).Container.c.
                         super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                         _M_impl.super__Deque_impl_data._M_map_size);
  local_28._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 (in_stack_ffffffffffffff78);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end(in_stack_ffffffffffffff78)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                             *)in_stack_ffffffffffffff78), bVar1) {
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator*(&local_28);
    pNVar4 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                       ((CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U> *
                        )in_stack_ffffffffffffff98,(PSNode **)in_stack_ffffffffffffff90);
    if (pNVar4->dfs_id == 0) {
      _compute(in_RSI,n_00);
      puVar2 = std::min<unsigned_int>((uint *)((long)&n_00->_vptr_PSNode + 4),&pNVar4->lowpt);
      *(uint *)((long)&n_00->_vptr_PSNode + 4) = *puVar2;
    }
    else if ((pNVar4->on_stack & 1U) != 0) {
      puVar2 = std::min<unsigned_int>((uint *)((long)&n_00->_vptr_PSNode + 4),&pNVar4->dfs_id);
      *(uint *)((long)&n_00->_vptr_PSNode + 4) = *puVar2;
    }
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_28);
  }
  if (*(uint *)((long)&n_00->_vptr_PSNode + 4) == *(uint *)&n_00->_vptr_PSNode) {
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::vector
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x1599b3);
    sVar3 = std::
            vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
            ::size((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
                    *)(in_RDI + 0x1b));
    do {
      this_00 = (QueueLIFO<dg::pta::PSNode_*> *)(in_RDI + 10);
      ADT::QueueLIFO<dg::pta::PSNode_*>::top((QueueLIFO<dg::pta::PSNode_*> *)0x1599df);
      pNVar4 = CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                         ((CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>
                           *)in_stack_ffffffffffffff98,(PSNode **)in_stack_ffffffffffffff90);
      if (pNVar4->dfs_id < *(uint *)&n_00->_vptr_PSNode) break;
      in_stack_ffffffffffffff98 = ADT::QueueLIFO<dg::pta::PSNode_*>::pop(this_00);
      in_stack_ffffffffffffff90 =
           CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::operator[]
                     ((CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U> *)
                      in_stack_ffffffffffffff98,(PSNode **)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff90->on_stack = false;
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                 in_stack_ffffffffffffff90,in_RDI);
      SubgraphNode<dg::pta::PSNode>::setSCCId
                (&in_stack_ffffffffffffff98->super_SubgraphNode<dg::pta::PSNode>,(uint)sVar3);
      bVar1 = ADT::QueueLIFO<dg::pta::PSNode_*>::empty((QueueLIFO<dg::pta::PSNode_*> *)0x159a55);
    } while (!bVar1);
    std::
    vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
    ::push_back((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
                 *)this_00,in_stack_ffffffffffffff78);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~vector
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void _compute(NodeT *n) {
        auto &info = _info[n];
        // here we using the fact that we are a friend class
        // of SubgraphNode. If we would need to make this
        // algorithm more generinc, we add setters/getters.
        info.dfs_id = info.lowpt = ++index;
        info.on_stack = true;
        stack.push(n);

        for (auto *succ : n->successors()) {
            auto &succ_info = _info[succ];
            if (succ_info.dfs_id == 0) {
                assert(!succ_info.on_stack);
                _compute(succ);
                info.lowpt = std::min(info.lowpt, succ_info.lowpt);
            } else if (succ_info.on_stack) {
                info.lowpt = std::min(info.lowpt, succ_info.dfs_id);
            }
        }

        if (info.lowpt == info.dfs_id) {
            SCC_component_t component;
            size_t component_num = scc.size();

            NodeT *w;
            while (_info[stack.top()].dfs_id >= info.dfs_id) {
                w = stack.pop();
                auto &winfo = _info[w];
                assert(winfo.on_stack == true);
                winfo.on_stack = false;
                component.push_back(w);
                // the numbers scc_id give
                // a reverse topological order
                w->setSCCId(component_num);

                if (stack.empty())
                    break;
            }

            scc.push_back(std::move(component));
        }
    }